

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

bool llvm::ARM::getExtensionFeatures
               (uint Extensions,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  bool bVar1;
  StringRef local_20;
  
  if (Extensions != 0) {
    if ((Extensions & 2) == 0) {
      local_20.Data = "-crc";
    }
    else {
      local_20.Data = "+crc";
    }
    local_20.Length = 4;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_20);
    if ((Extensions >> 10 & 1) == 0) {
      local_20.Data = "-dsp";
    }
    else {
      local_20.Data = "+dsp";
    }
    local_20.Length = 4;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_20);
    if ((Extensions >> 0xc & 1) == 0) {
      local_20.Data = "-ras";
    }
    else {
      local_20.Data = "+ras";
    }
    local_20.Length = 4;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_20);
    if ((Extensions >> 0xe & 1) == 0) {
      local_20.Data = "-dotprod";
    }
    else {
      local_20.Data = "+dotprod";
    }
    local_20.Length = 8;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_20);
    bVar1 = getHWDivFeatures(Extensions,Features);
    return bVar1;
  }
  return false;
}

Assistant:

bool llvm::ARM::getExtensionFeatures(unsigned Extensions,
                                     std::vector<StringRef> &Features) {

  if (Extensions == ARM::AEK_INVALID)
    return false;

  if (Extensions & ARM::AEK_CRC)
    Features.push_back("+crc");
  else
    Features.push_back("-crc");

  if (Extensions & ARM::AEK_DSP)
    Features.push_back("+dsp");
  else
    Features.push_back("-dsp");

  if (Extensions & ARM::AEK_RAS)
    Features.push_back("+ras");
  else
    Features.push_back("-ras");

  if (Extensions & ARM::AEK_DOTPROD)
    Features.push_back("+dotprod");
  else
    Features.push_back("-dotprod");

  return getHWDivFeatures(Extensions, Features);
}